

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_hold(nn_sock *self)

{
  nn_sock *self_local;
  int local_4;
  
  if (self->state - 1U < 2) {
    self->holds = self->holds + 1;
    local_4 = 0;
  }
  else {
    local_4 = -9;
  }
  return local_4;
}

Assistant:

int nn_sock_hold (struct nn_sock *self)
{
    switch (self->state) {
    case NN_SOCK_STATE_ACTIVE:
    case NN_SOCK_STATE_INIT:
        self->holds++;
        return 0;
    case NN_SOCK_STATE_STOPPING:
    case NN_SOCK_STATE_STOPPING_EPS:
    case NN_SOCK_STATE_FINI:
    default:
        return -EBADF;
    }
}